

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O1

void __thiscall PA3Application::RenderObject::updateProgram(RenderObject *this)

{
  Program *this_00;
  string local_40;
  
  this_00 = (this->m_prog).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"M","");
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(this_00,&local_40,&this->m_mw);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PA3Application::RenderObject::updateProgram() const
{
  m_prog->setUniform("M", m_mw);
}